

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolutionNeighbourhood.cpp
# Opt level: O0

void __thiscall SolutionNeighbourhood::undoLastMove(SolutionNeighbourhood *this)

{
  pointer *pppTVar1;
  Turn *pTVar2;
  Solution *pSVar3;
  Move *pMVar4;
  Turn *pTVar5;
  bool bVar6;
  __type _Var7;
  int iVar8;
  vector<std::vector<Turn_*,_std::allocator<Turn_*>_>,_std::allocator<std::vector<Turn_*,_std::allocator<Turn_*>_>_>_>
  *pvVar9;
  Position *pPVar10;
  const_reference pvVar11;
  reference ppTVar12;
  ShiftType *pSVar13;
  string *psVar14;
  string *psVar15;
  NurseSolution *pNVar16;
  NurseSolution *ns2;
  Turn *turn_3;
  iterator __end2_3;
  iterator __begin2_3;
  vector<Turn_*,_std::allocator<Turn_*>_> *__range2_3;
  Turn *turn_2;
  iterator __end2_2;
  iterator __begin2_2;
  vector<Turn_*,_std::allocator<Turn_*>_> *__range2_2;
  Turn *lastTurn;
  Turn *initialTurn;
  Turn *turn_1;
  iterator __end2_1;
  iterator __begin2_1;
  vector<Turn_*,_std::allocator<Turn_*>_> *__range2_1;
  Turn *turn;
  iterator __end2;
  iterator __begin2;
  vector<Turn_*,_std::allocator<Turn_*>_> *__range2;
  undefined1 local_40 [8];
  vector<Turn_*,_std::allocator<Turn_*>_> day2;
  vector<Turn_*,_std::allocator<Turn_*>_> day1;
  SolutionNeighbourhood *this_local;
  
  if (this->lastMove != (Move *)0x0) {
    std::vector<Turn_*,_std::allocator<Turn_*>_>::vector
              ((vector<Turn_*,_std::allocator<Turn_*>_> *)
               &day2.super__Vector_base<Turn_*,_std::allocator<Turn_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    std::vector<Turn_*,_std::allocator<Turn_*>_>::vector
              ((vector<Turn_*,_std::allocator<Turn_*>_> *)local_40);
    iVar8 = Move::getMoveType(this->lastMove);
    if (iVar8 == 0) {
      pvVar9 = Solution::getTurns(this->solution);
      pPVar10 = Move::getLastPosition(this->lastMove);
      iVar8 = Position::getDay(pPVar10);
      pvVar11 = std::
                vector<std::vector<Turn_*,_std::allocator<Turn_*>_>,_std::allocator<std::vector<Turn_*,_std::allocator<Turn_*>_>_>_>
                ::operator[](pvVar9,(long)iVar8);
      std::vector<Turn_*,_std::allocator<Turn_*>_>::operator=
                ((vector<Turn_*,_std::allocator<Turn_*>_> *)
                 &day2.super__Vector_base<Turn_*,_std::allocator<Turn_*>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,pvVar11);
      pppTVar1 = &day2.super__Vector_base<Turn_*,_std::allocator<Turn_*>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage;
      __end2 = std::vector<Turn_*,_std::allocator<Turn_*>_>::begin
                         ((vector<Turn_*,_std::allocator<Turn_*>_> *)pppTVar1);
      turn = (Turn *)std::vector<Turn_*,_std::allocator<Turn_*>_>::end
                               ((vector<Turn_*,_std::allocator<Turn_*>_> *)pppTVar1);
      while (bVar6 = __gnu_cxx::operator!=
                               (&__end2,(__normal_iterator<Turn_**,_std::vector<Turn_*,_std::allocator<Turn_*>_>_>
                                         *)&turn), bVar6) {
        ppTVar12 = __gnu_cxx::
                   __normal_iterator<Turn_**,_std::vector<Turn_*,_std::allocator<Turn_*>_>_>::
                   operator*(&__end2);
        pTVar2 = *ppTVar12;
        pSVar13 = Turn::getShiftType(pTVar2);
        psVar14 = ShiftType::getId_abi_cxx11_(pSVar13);
        pPVar10 = Move::getLastPosition(this->lastMove);
        pSVar13 = Position::getShiftType(pPVar10);
        psVar15 = ShiftType::getId_abi_cxx11_(pSVar13);
        _Var7 = std::operator==(psVar14,psVar15);
        if (_Var7) {
          psVar14 = Turn::getSkill_abi_cxx11_(pTVar2);
          pPVar10 = Move::getLastPosition(this->lastMove);
          psVar15 = Position::getSkill_abi_cxx11_(pPVar10);
          _Var7 = std::operator==(psVar14,psVar15);
          if (_Var7) {
            pSVar3 = this->solution;
            pNVar16 = Move::getMovedNurse(this->lastMove);
            Solution::removeNurseFromTurn(pSVar3,pNVar16,pTVar2);
            pMVar4 = this->lastMove;
            if (pMVar4 != (Move *)0x0) {
              Move::~Move(pMVar4);
              operator_delete(pMVar4,0x70);
            }
            this->lastMove = (Move *)0x0;
            goto LAB_001368d3;
          }
        }
        __gnu_cxx::__normal_iterator<Turn_**,_std::vector<Turn_*,_std::allocator<Turn_*>_>_>::
        operator++(&__end2);
      }
    }
    else if (iVar8 == 1) {
      pvVar9 = Solution::getTurns(this->solution);
      pPVar10 = Move::getInitialPosition(this->lastMove);
      iVar8 = Position::getDay(pPVar10);
      pvVar11 = std::
                vector<std::vector<Turn_*,_std::allocator<Turn_*>_>,_std::allocator<std::vector<Turn_*,_std::allocator<Turn_*>_>_>_>
                ::operator[](pvVar9,(long)iVar8);
      std::vector<Turn_*,_std::allocator<Turn_*>_>::operator=
                ((vector<Turn_*,_std::allocator<Turn_*>_> *)
                 &day2.super__Vector_base<Turn_*,_std::allocator<Turn_*>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,pvVar11);
      pppTVar1 = &day2.super__Vector_base<Turn_*,_std::allocator<Turn_*>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage;
      __end2_1 = std::vector<Turn_*,_std::allocator<Turn_*>_>::begin
                           ((vector<Turn_*,_std::allocator<Turn_*>_> *)pppTVar1);
      turn_1 = (Turn *)std::vector<Turn_*,_std::allocator<Turn_*>_>::end
                                 ((vector<Turn_*,_std::allocator<Turn_*>_> *)pppTVar1);
      while (bVar6 = __gnu_cxx::operator!=
                               (&__end2_1,
                                (__normal_iterator<Turn_**,_std::vector<Turn_*,_std::allocator<Turn_*>_>_>
                                 *)&turn_1), bVar6) {
        ppTVar12 = __gnu_cxx::
                   __normal_iterator<Turn_**,_std::vector<Turn_*,_std::allocator<Turn_*>_>_>::
                   operator*(&__end2_1);
        pTVar2 = *ppTVar12;
        pSVar13 = Turn::getShiftType(pTVar2);
        psVar14 = ShiftType::getId_abi_cxx11_(pSVar13);
        pPVar10 = Move::getInitialPosition(this->lastMove);
        pSVar13 = Position::getShiftType(pPVar10);
        psVar15 = ShiftType::getId_abi_cxx11_(pSVar13);
        _Var7 = std::operator==(psVar14,psVar15);
        if (_Var7) {
          psVar14 = Turn::getSkill_abi_cxx11_(pTVar2);
          pPVar10 = Move::getInitialPosition(this->lastMove);
          psVar15 = Position::getSkill_abi_cxx11_(pPVar10);
          _Var7 = std::operator==(psVar14,psVar15);
          if (_Var7) {
            pNVar16 = Move::getMovedNurse(this->lastMove);
            NurseSolution::addTurn(pNVar16,pTVar2);
            goto LAB_001368d3;
          }
        }
        __gnu_cxx::__normal_iterator<Turn_**,_std::vector<Turn_*,_std::allocator<Turn_*>_>_>::
        operator++(&__end2_1);
      }
    }
    else if (iVar8 == 2) {
      pvVar9 = Solution::getTurns(this->solution);
      pPVar10 = Move::getInitialPosition(this->lastMove);
      iVar8 = Position::getDay(pPVar10);
      pvVar11 = std::
                vector<std::vector<Turn_*,_std::allocator<Turn_*>_>,_std::allocator<std::vector<Turn_*,_std::allocator<Turn_*>_>_>_>
                ::operator[](pvVar9,(long)iVar8);
      std::vector<Turn_*,_std::allocator<Turn_*>_>::operator=
                ((vector<Turn_*,_std::allocator<Turn_*>_> *)
                 &day2.super__Vector_base<Turn_*,_std::allocator<Turn_*>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,pvVar11);
      pvVar9 = Solution::getTurns(this->solution);
      pPVar10 = Move::getLastPosition(this->lastMove);
      iVar8 = Position::getDay(pPVar10);
      pvVar11 = std::
                vector<std::vector<Turn_*,_std::allocator<Turn_*>_>,_std::allocator<std::vector<Turn_*,_std::allocator<Turn_*>_>_>_>
                ::operator[](pvVar9,(long)iVar8);
      std::vector<Turn_*,_std::allocator<Turn_*>_>::operator=
                ((vector<Turn_*,_std::allocator<Turn_*>_> *)local_40,pvVar11);
      pppTVar1 = &day2.super__Vector_base<Turn_*,_std::allocator<Turn_*>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage;
      __end2_2 = std::vector<Turn_*,_std::allocator<Turn_*>_>::begin
                           ((vector<Turn_*,_std::allocator<Turn_*>_> *)pppTVar1);
      turn_2 = (Turn *)std::vector<Turn_*,_std::allocator<Turn_*>_>::end
                                 ((vector<Turn_*,_std::allocator<Turn_*>_> *)pppTVar1);
      while (bVar6 = __gnu_cxx::operator!=
                               (&__end2_2,
                                (__normal_iterator<Turn_**,_std::vector<Turn_*,_std::allocator<Turn_*>_>_>
                                 *)&turn_2), bVar6) {
        ppTVar12 = __gnu_cxx::
                   __normal_iterator<Turn_**,_std::vector<Turn_*,_std::allocator<Turn_*>_>_>::
                   operator*(&__end2_2);
        pTVar2 = *ppTVar12;
        pSVar13 = Turn::getShiftType(pTVar2);
        psVar14 = ShiftType::getId_abi_cxx11_(pSVar13);
        pPVar10 = Move::getInitialPosition(this->lastMove);
        pSVar13 = Position::getShiftType(pPVar10);
        psVar15 = ShiftType::getId_abi_cxx11_(pSVar13);
        _Var7 = std::operator==(psVar14,psVar15);
        pTVar5 = lastTurn;
        if (_Var7) {
          psVar14 = Turn::getSkill_abi_cxx11_(pTVar2);
          pPVar10 = Move::getInitialPosition(this->lastMove);
          psVar15 = Position::getSkill_abi_cxx11_(pPVar10);
          _Var7 = std::operator==(psVar14,psVar15);
          pTVar5 = pTVar2;
          if (!_Var7) {
            pTVar5 = lastTurn;
          }
        }
        lastTurn = pTVar5;
        __gnu_cxx::__normal_iterator<Turn_**,_std::vector<Turn_*,_std::allocator<Turn_*>_>_>::
        operator++(&__end2_2);
      }
      __end2_3 = std::vector<Turn_*,_std::allocator<Turn_*>_>::begin
                           ((vector<Turn_*,_std::allocator<Turn_*>_> *)local_40);
      turn_3 = (Turn *)std::vector<Turn_*,_std::allocator<Turn_*>_>::end
                                 ((vector<Turn_*,_std::allocator<Turn_*>_> *)local_40);
      while (bVar6 = __gnu_cxx::operator!=
                               (&__end2_3,
                                (__normal_iterator<Turn_**,_std::vector<Turn_*,_std::allocator<Turn_*>_>_>
                                 *)&turn_3), bVar6) {
        ppTVar12 = __gnu_cxx::
                   __normal_iterator<Turn_**,_std::vector<Turn_*,_std::allocator<Turn_*>_>_>::
                   operator*(&__end2_3);
        pTVar2 = *ppTVar12;
        pSVar13 = Turn::getShiftType(pTVar2);
        psVar14 = ShiftType::getId_abi_cxx11_(pSVar13);
        pPVar10 = Move::getLastPosition(this->lastMove);
        pSVar13 = Position::getShiftType(pPVar10);
        psVar15 = ShiftType::getId_abi_cxx11_(pSVar13);
        _Var7 = std::operator==(psVar14,psVar15);
        pTVar5 = (Turn *)__range2_2;
        if (_Var7) {
          psVar14 = Turn::getSkill_abi_cxx11_(pTVar2);
          pPVar10 = Move::getLastPosition(this->lastMove);
          psVar15 = Position::getSkill_abi_cxx11_(pPVar10);
          _Var7 = std::operator==(psVar14,psVar15);
          pTVar5 = pTVar2;
          if (!_Var7) {
            pTVar5 = (Turn *)__range2_2;
          }
        }
        __range2_2 = (vector<Turn_*,_std::allocator<Turn_*>_> *)pTVar5;
        __gnu_cxx::__normal_iterator<Turn_**,_std::vector<Turn_*,_std::allocator<Turn_*>_>_>::
        operator++(&__end2_3);
      }
      pSVar3 = this->solution;
      pNVar16 = Move::getMovedNurse(this->lastMove);
      ns2 = Move::getTradedNurse(this->lastMove);
      Solution::atomicSwitchNurseTurns(pSVar3,pNVar16,(Turn *)__range2_2,ns2,lastTurn);
      pMVar4 = this->lastMove;
      if (pMVar4 != (Move *)0x0) {
        Move::~Move(pMVar4);
        operator_delete(pMVar4,0x70);
      }
      this->lastMove = (Move *)0x0;
    }
    pMVar4 = this->lastMove;
    if (pMVar4 != (Move *)0x0) {
      Move::~Move(pMVar4);
      operator_delete(pMVar4,0x70);
    }
    this->lastMove = (Move *)0x0;
LAB_001368d3:
    std::vector<Turn_*,_std::allocator<Turn_*>_>::~vector
              ((vector<Turn_*,_std::allocator<Turn_*>_> *)local_40);
    std::vector<Turn_*,_std::allocator<Turn_*>_>::~vector
              ((vector<Turn_*,_std::allocator<Turn_*>_> *)
               &day2.super__Vector_base<Turn_*,_std::allocator<Turn_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
  }
  return;
}

Assistant:

void SolutionNeighbourhood::undoLastMove(){
    if(lastMove == nullptr)
        return;
    vector<Turn*> day1 , day2;
    switch (lastMove->getMoveType())
    {
        case 0:
            //insert so we have to remove
            day1 = solution->getTurns()[lastMove->getLastPosition().getDay()];
            for(Turn* turn : day1)
            {
                if(turn->getShiftType()->getId() == lastMove->getLastPosition().getShiftType()->getId() && turn->getSkill() == lastMove->getLastPosition().getSkill()) {
                    solution->removeNurseFromTurn(lastMove->getMovedNurse(),turn);
                    delete lastMove;
                    lastMove = nullptr;
                    return;
                }
            }
            break;
        case 1:
            //remove so we have to insert
            day1 = solution->getTurns()[lastMove->getInitialPosition().getDay()];
            for(Turn* turn : day1)
            {
                if(turn->getShiftType()->getId() == lastMove->getInitialPosition().getShiftType()->getId() && turn->getSkill() == lastMove->getInitialPosition().getSkill()){
                    lastMove->getMovedNurse()->addTurn(turn);
                return;
                }
            }
            break;
        case 2:
            //trade so we have to do the inverse, so 2 to 1, and 1 to 2
            day1 = solution->getTurns()[lastMove->getInitialPosition().getDay()];
            day2 = solution->getTurns()[lastMove->getLastPosition().getDay()];

            Turn* initialTurn;
            Turn* lastTurn;

            for(Turn* turn : day1)
            {
                if(turn->getShiftType()->getId() == lastMove->getInitialPosition().getShiftType()->getId() && turn->getSkill() == lastMove->getInitialPosition().getSkill())
                    initialTurn = turn;
            }
            for(Turn* turn : day2)
            {
                if(turn->getShiftType()->getId() == lastMove->getLastPosition().getShiftType()->getId() && turn->getSkill() == lastMove->getLastPosition().getSkill())
                    lastTurn = turn;
            }

            //atomicSwitchNurseTurns, invert what lastMove did
            //NS1 / LastPosition / NS2 / InitialPosition
            solution->atomicSwitchNurseTurns(lastMove->getMovedNurse(),lastTurn,lastMove->getTradedNurse(),initialTurn);
            //if(!solution->atomicSwitchNurseTurns(lastMove->getMovedNurse(),lastTurn,lastMove->getTradedNurse(),initialTurn))
                //cout << "ERRO" << endl;
            delete lastMove;
            lastMove = nullptr;
            break;
    }

    delete lastMove;
    lastMove = nullptr;
}